

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_mipmapped_texture.cpp
# Opt level: O2

void __thiscall crnlib::mip_level::mip_level(mip_level *this,mip_level *other)

{
  this->m_width = 0;
  this->m_height = 0;
  this->m_comp_flags = cDefaultCompFlags;
  *(undefined8 *)((long)&this->m_pDXTImage + 4) = 0;
  *(undefined8 *)&this->m_format = 0;
  *(undefined8 *)((long)&this->m_pImage + 4) = 0;
  operator=(this,other);
  return;
}

Assistant:

mip_level::mip_level(const mip_level& other)
    : m_width(0),
      m_height(0),
      m_comp_flags(pixel_format_helpers::cDefaultCompFlags),
      m_format(PIXEL_FMT_INVALID),
      m_pImage(nullptr),
      m_pDXTImage(nullptr),
      m_orient_flags(cDefaultOrientationFlags) {
  *this = other;
}